

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
          (type_caster_generic *this,handle src,bool convert)

{
  byte bVar1;
  PyTypeObject *t;
  undefined8 *puVar2;
  pointer pp_Var3;
  vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *pvVar4;
  pointer pp_Var5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var9;
  internals *this_00;
  iterator iVar10;
  undefined7 in_register_00000011;
  undefined4 uVar11;
  pointer pp_Var12;
  type_info *ptVar13;
  undefined8 *puVar14;
  pointer pp_Var15;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar16;
  object temp;
  undefined4 in_stack_ffffffffffffffa8;
  value_and_holder local_50;
  
  if (src.m_ptr == (PyObject *)0x0) {
LAB_0011774e:
    bVar6 = false;
  }
  else {
    if (this->typeinfo == (type_info *)0x0) {
      bVar6 = try_load_foreign_module_local(this,src);
      return bVar6;
    }
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      if (!convert) goto LAB_0011774e;
      this->value = (void *)0x0;
    }
    else {
      t = (src.m_ptr)->ob_type;
      if (t != this->typeinfo->type) {
        iVar7 = PyType_IsSubtype(t);
        if (iVar7 == 0) {
LAB_00117667:
          if (convert != false) {
            pp_Var12 = (this->typeinfo->implicit_conversions).
                       super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pp_Var3 = (this->typeinfo->implicit_conversions).
                      super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (pp_Var12 != pp_Var3) {
              do {
                local_50.inst = (instance *)(**pp_Var12)(src.m_ptr,this->typeinfo->type);
                bVar6 = load_impl<pybind11::detail::type_caster_generic>
                                  (this,(handle)local_50.inst,false);
                if (bVar6) {
                  loader_life_support::add_patient((handle)local_50.inst);
                  object::~object((object *)&local_50);
                  if (bVar6) goto LAB_00117775;
                }
                else {
                  object::~object((object *)&local_50);
                }
                pp_Var12 = pp_Var12 + 1;
              } while (pp_Var12 != pp_Var3);
            }
            pvVar4 = this->typeinfo->direct_conversions;
            pp_Var15 = (pvVar4->
                       super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            pp_Var5 = (pvVar4->
                      super__Vector_base<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            bVar6 = pp_Var15 == pp_Var5;
            if (!bVar6) {
              bVar6 = (**pp_Var15)(src.m_ptr,&this->value);
              while( true ) {
                if (bVar6 != false) {
                  return true;
                }
                pp_Var15 = pp_Var15 + 1;
                bVar6 = pp_Var15 == pp_Var5;
                if (bVar6) break;
                bVar6 = (**pp_Var15)(src.m_ptr,&this->value);
              }
            }
            if (!bVar6) {
              return true;
            }
          }
          if ((this->typeinfo->field_0x90 & 8) != 0) {
            local_50.inst = (instance *)this->typeinfo->cpptype;
            this_00 = get_internals();
            iVar10 = std::
                     _Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<std::type_index,_std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)this_00,(key_type *)&local_50);
            if (iVar10.
                super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                ._M_cur == (__node_type *)0x0) {
              ptVar13 = (type_info *)0x0;
            }
            else {
              ptVar13 = *(type_info **)
                         ((long)iVar10.
                                super__Node_iterator_base<std::pair<const_std::type_index,_pybind11::detail::type_info_*>,_false>
                                ._M_cur + 0x10);
            }
            if (ptVar13 != (type_info *)0x0) {
              this->typeinfo = ptVar13;
              bVar6 = load_impl<pybind11::detail::type_caster_generic>(this,src,false);
              return bVar6;
            }
          }
          bVar6 = try_load_foreign_module_local(this,src);
          return bVar6;
        }
        uVar11 = (undefined4)CONCAT71(in_register_00000011,convert);
        pVar16 = all_type_info_get_cache((PyTypeObject *)CONCAT44(uVar11,in_stack_ffffffffffffffa8))
        ;
        _Var9 = pVar16.first.
                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                ._M_cur;
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          all_type_info_populate
                    (t,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                        *)((long)_Var9.
                                 super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                 ._M_cur + 0x10));
        }
        convert = SUB41(uVar11,0);
        bVar1 = this->typeinfo->field_0x90;
        puVar14 = *(undefined8 **)
                   ((long)_Var9.
                          super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                          ._M_cur + 0x10);
        puVar2 = *(undefined8 **)
                  ((long)_Var9.
                         super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                         ._M_cur + 0x18);
        if (((long)puVar2 - (long)puVar14 != 8) ||
           (((bVar1 & 1) == 0 && (*(PyTypeObject **)*puVar14 != this->typeinfo->type)))) {
          if (puVar14 != puVar2 && 8 < (ulong)((long)puVar2 - (long)puVar14)) {
            do {
              ptVar13 = (type_info *)*puVar14;
              if ((bVar1 & 1) == 0) {
                uVar8 = (uint)(ptVar13->type == this->typeinfo->type);
              }
              else {
                uVar8 = PyType_IsSubtype();
              }
              convert = SUB41(uVar11,0);
              if (uVar8 != 0) {
                instance::get_value_and_holder(&local_50,(instance *)src.m_ptr,ptVar13,true);
                goto LAB_00117770;
              }
              puVar14 = puVar14 + 1;
            } while (puVar14 != puVar2);
          }
          bVar6 = try_implicit_casts(this,src,convert);
          if (bVar6) {
            return true;
          }
          goto LAB_00117667;
        }
      }
      instance::get_value_and_holder(&local_50,(instance *)src.m_ptr,(type_info *)0x0,true);
LAB_00117770:
      load_value(this,&local_50);
    }
LAB_00117775:
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

PYBIND11_NOINLINE inline handle get_type_handle(const std::type_info &tp, bool throw_if_missing) {
    detail::type_info *type_info = get_type_info(tp, throw_if_missing);
    return handle(type_info ? ((PyObject *) type_info->type) : nullptr);
}